

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomProperty::write(DomProperty *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  QArrayData *pQVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QString local_40;
  long local_28;
  
  aVar1._4_4_ = in_register_00000034;
  aVar1._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"property";
    local_40.d.size = 8;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar6.m_size = (size_t)local_40.d.ptr;
  QVar6.field_0.m_data = aVar1.m_data;
  QXmlStreamWriter::writeStartElement(QVar6);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_name == true) {
    pQVar4 = &((this->m_attr_name).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_name).d.ptr;
    if (pQVar4 == (QArrayData *)0x0) {
      QVar8.m_size = (size_t)L"name";
      QVar8.field_0.m_data = aVar1.m_data;
      QVar14.m_size = (size_t)pcVar2;
      QVar14.field_0.m_data = (void *)0x8000000000000004;
      QXmlStreamWriter::writeAttribute(QVar8,QVar14);
    }
    else {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar7.m_size = (size_t)L"name";
      QVar7.field_0.m_data = aVar1.m_data;
      QVar13.m_size = (size_t)pcVar2;
      QVar13.field_0.m_data = (void *)0x8000000000000004;
      QXmlStreamWriter::writeAttribute(QVar7,QVar13);
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  if (this->m_has_attr_stdset == true) {
    QString::number((int)&local_40,this->m_attr_stdset);
    QVar9.m_size = (size_t)L"stdset";
    QVar9.field_0.m_data = aVar1.m_data;
    QVar15.m_size = (size_t)local_40.d.ptr;
    QVar15.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeAttribute(QVar9,QVar15);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  switch(this->m_kind) {
  case Bool:
    pQVar4 = &((this->m_bool).d.d)->super_QArrayData;
    pcVar2 = (this->m_bool).d.ptr;
    if (pQVar4 == (QArrayData *)0x0) {
      aVar5.m_data = (void *)0x8000000000000004;
      pcVar3 = L"bool";
LAB_0015d1e0:
      QVar12.m_size = (size_t)pcVar3;
      QVar12.field_0.m_data = aVar1.m_data;
      QVar18.m_size = (size_t)pcVar2;
      QVar18.field_0.m_data = aVar5.m_data;
      QXmlStreamWriter::writeTextElement(QVar12,QVar18);
      goto switchD_0015c996_default;
    }
    LOCK();
    (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    aVar5.m_data = (void *)0x8000000000000004;
    pcVar3 = L"bool";
    goto LAB_0015cdce;
  case Color:
    if (this->m_color == (DomColor *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"color";
    local_40.d.size = 5;
    DomColor::write(this->m_color,__fd,&local_40,0x1804a0);
    break;
  case Cstring:
    pQVar4 = &((this->m_cstring).d.d)->super_QArrayData;
    pcVar2 = (this->m_cstring).d.ptr;
    if (pQVar4 == (QArrayData *)0x0) {
      aVar5 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x8000000000000007;
      pcVar3 = L"cstring";
      goto LAB_0015d1e0;
    }
    LOCK();
    (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    aVar5 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x8000000000000007;
    pcVar3 = L"cstring";
    goto LAB_0015cdce;
  case Cursor:
    QString::number((int)&local_40,this->m_cursor);
    aVar5.m_data = (void *)0x8000000000000006;
    pcVar2 = L"cursor";
    goto LAB_0015d04d;
  case CursorShape:
    pQVar4 = &((this->m_cursorShape).d.d)->super_QArrayData;
    pcVar2 = (this->m_cursorShape).d.ptr;
    if (pQVar4 == (QArrayData *)0x0) {
      aVar5.m_data = (void *)0x800000000000000b;
      pcVar3 = L"cursorShape";
      goto LAB_0015d1e0;
    }
    LOCK();
    (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    aVar5.m_data = (void *)0x800000000000000b;
    pcVar3 = L"cursorShape";
    goto LAB_0015cdce;
  case Enum:
    pQVar4 = &((this->m_enum).d.d)->super_QArrayData;
    pcVar2 = (this->m_enum).d.ptr;
    if (pQVar4 == (QArrayData *)0x0) {
      aVar5.m_data = (void *)0x8000000000000004;
      pcVar3 = L"enum";
      goto LAB_0015d1e0;
    }
    LOCK();
    (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    aVar5.m_data = (void *)0x8000000000000004;
    pcVar3 = L"enum";
    goto LAB_0015cdce;
  case Font:
    if (this->m_font == (DomFont *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"font";
    local_40.d.size = 4;
    DomFont::write(this->m_font,__fd,&local_40,0x1804a0);
    break;
  case IconSet:
    if (this->m_iconSet == (DomResourceIcon *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"iconset";
    local_40.d.size = 7;
    DomResourceIcon::write(this->m_iconSet,__fd,&local_40,0x1804a0);
    break;
  case Pixmap:
    if (this->m_pixmap == (DomResourcePixmap *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"pixmap";
    local_40.d.size = 6;
    DomResourcePixmap::write(this->m_pixmap,__fd,&local_40,0x1804a0);
    break;
  case Palette:
    if (this->m_palette == (DomPalette *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"palette";
    local_40.d.size = 7;
    DomPalette::write(this->m_palette,__fd,&local_40,0x1804a0);
    break;
  case Point:
    if (this->m_point == (DomPoint *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"point";
    local_40.d.size = 5;
    DomPoint::write(this->m_point,__fd,&local_40,0x1804a0);
    break;
  case Rect:
    if (this->m_rect == (DomRect *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"rect";
    local_40.d.size = 4;
    DomRect::write(this->m_rect,__fd,&local_40,0x1804a0);
    break;
  case Set:
    pQVar4 = &((this->m_set).d.d)->super_QArrayData;
    pcVar2 = (this->m_set).d.ptr;
    if (pQVar4 == (QArrayData *)0x0) {
      aVar5 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x8000000000000003;
      pcVar3 = L"set";
      goto LAB_0015d1e0;
    }
    LOCK();
    (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    aVar5 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x8000000000000003;
    pcVar3 = L"set";
LAB_0015cdce:
    QVar10.m_size = (size_t)pcVar3;
    QVar10.field_0.m_data = aVar1.m_data;
    QVar16.m_size = (size_t)pcVar2;
    QVar16.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar10,QVar16);
    LOCK();
    (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i != 0)
    goto switchD_0015c996_default;
    goto LAB_0015d169;
  case Locale:
    if (this->m_locale == (DomLocale *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"locale";
    local_40.d.size = 6;
    DomLocale::write(this->m_locale,__fd,&local_40,0x1804a0);
    break;
  case SizePolicy:
    if (this->m_sizePolicy == (DomSizePolicy *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"sizepolicy";
    local_40.d.size = 10;
    DomSizePolicy::write(this->m_sizePolicy,__fd,&local_40,0x1804a0);
    break;
  case Size:
    if (this->m_size == (DomSize *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"size";
    local_40.d.size = 4;
    DomSize::write(this->m_size,__fd,&local_40,0x1804a0);
    break;
  case String:
    if (this->m_string == (DomString *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"string";
    local_40.d.size = 6;
    DomString::write(this->m_string,__fd,&local_40,0x1804a0);
    break;
  case StringList:
    if (this->m_stringList == (DomStringList *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"stringlist";
    local_40.d.size = 10;
    DomStringList::write(this->m_stringList,__fd,&local_40,0x1804a0);
    break;
  case Number:
    QString::number((int)&local_40,this->m_number);
    aVar5.m_data = (void *)0x8000000000000006;
    pcVar2 = L"number";
    goto LAB_0015d04d;
  case Float:
    QString::number((double)this->m_float,(char)&local_40,0x66);
    aVar5.m_data = (void *)0x8000000000000005;
    pcVar2 = L"float";
    goto LAB_0015d04d;
  case Double:
    QString::number(this->m_double,(char)&local_40,0x66);
    aVar5.m_data = (void *)0x8000000000000006;
    pcVar2 = L"double";
    goto LAB_0015d04d;
  case Date:
    if (this->m_date == (DomDate *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"date";
    local_40.d.size = 4;
    DomDate::write(this->m_date,__fd,&local_40,0x1804a0);
    break;
  case Time:
    if (this->m_time == (DomTime *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"time";
    local_40.d.size = 4;
    DomTime::write(this->m_time,__fd,&local_40,0x1804a0);
    break;
  case DateTime:
    if (this->m_dateTime == (DomDateTime *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"datetime";
    local_40.d.size = 8;
    DomDateTime::write(this->m_dateTime,__fd,&local_40,0x1804a0);
    break;
  case PointF:
    if (this->m_pointF == (DomPointF *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"pointf";
    local_40.d.size = 6;
    DomPointF::write(this->m_pointF,__fd,&local_40,0x1804a0);
    break;
  case RectF:
    if (this->m_rectF == (DomRectF *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"rectf";
    local_40.d.size = 5;
    DomRectF::write(this->m_rectF,__fd,&local_40,0x1804a0);
    break;
  case SizeF:
    if (this->m_sizeF == (DomSizeF *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"sizef";
    local_40.d.size = 5;
    DomSizeF::write(this->m_sizeF,__fd,&local_40,0x1804a0);
    break;
  case LongLong:
    QString::number((longlong)&local_40,(int)this->m_longLong);
    aVar5.m_data = (void *)0x8000000000000008;
    pcVar2 = L"longLong";
    goto LAB_0015d04d;
  case Char:
    if (this->m_char == (DomChar *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"char";
    local_40.d.size = 4;
    DomChar::write(this->m_char,__fd,&local_40,0x1804a0);
    break;
  case Url:
    if (this->m_url == (DomUrl *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"url";
    local_40.d.size = 3;
    DomUrl::write(this->m_url,__fd,&local_40,0x1804a0);
    break;
  case UInt:
    QString::number((uint)&local_40,this->m_UInt);
    aVar5.m_data = (void *)0x8000000000000004;
    pcVar2 = L"UInt";
    goto LAB_0015d04d;
  case ULongLong:
    QString::number((ulonglong)&local_40,(int)this->m_uLongLong);
    aVar5.m_data = (void *)0x8000000000000009;
    pcVar2 = L"uLongLong";
LAB_0015d04d:
    QVar11.m_size = (size_t)pcVar2;
    QVar11.field_0.m_data = aVar1.m_data;
    QVar17.m_size = (size_t)local_40.d.ptr;
    QVar17.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar11,QVar17);
    break;
  case Brush:
    if (this->m_brush == (DomBrush *)0x0) goto switchD_0015c996_default;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"brush";
    local_40.d.size = 5;
    DomBrush::write(this->m_brush,__fd,&local_40,0x1804a0);
    break;
  default:
    goto switchD_0015c996_default;
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pQVar4 = &(local_40.d.d)->super_QArrayData;
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_0015d169:
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
switchD_0015c996_default:
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomProperty::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("property") : tagName.toLower());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    if (hasAttributeStdset())
        writer.writeAttribute(u"stdset"_s, QString::number(attributeStdset()));

    switch (kind()) {
    case Bool:
        writer.writeTextElement(u"bool"_s, elementBool());
        break;

    case Color:
        if (m_color != nullptr)
            m_color->write(writer, u"color"_s);
        break;

    case Cstring:
        writer.writeTextElement(u"cstring"_s, elementCstring());
        break;

    case Cursor:
        writer.writeTextElement(u"cursor"_s, QString::number(elementCursor()));
        break;

    case CursorShape:
        writer.writeTextElement(u"cursorShape"_s, elementCursorShape());
        break;

    case Enum:
        writer.writeTextElement(u"enum"_s, elementEnum());
        break;

    case Font:
        if (m_font != nullptr)
            m_font->write(writer, u"font"_s);
        break;

    case IconSet:
        if (m_iconSet != nullptr)
            m_iconSet->write(writer, u"iconset"_s);
        break;

    case Pixmap:
        if (m_pixmap != nullptr)
            m_pixmap->write(writer, u"pixmap"_s);
        break;

    case Palette:
        if (m_palette != nullptr)
            m_palette->write(writer, u"palette"_s);
        break;

    case Point:
        if (m_point != nullptr)
            m_point->write(writer, u"point"_s);
        break;

    case Rect:
        if (m_rect != nullptr)
            m_rect->write(writer, u"rect"_s);
        break;

    case Set:
        writer.writeTextElement(u"set"_s, elementSet());
        break;

    case Locale:
        if (m_locale != nullptr)
            m_locale->write(writer, u"locale"_s);
        break;

    case SizePolicy:
        if (m_sizePolicy != nullptr)
            m_sizePolicy->write(writer, u"sizepolicy"_s);
        break;

    case Size:
        if (m_size != nullptr)
            m_size->write(writer, u"size"_s);
        break;

    case String:
        if (m_string != nullptr)
            m_string->write(writer, u"string"_s);
        break;

    case StringList:
        if (m_stringList != nullptr)
            m_stringList->write(writer, u"stringlist"_s);
        break;

    case Number:
        writer.writeTextElement(u"number"_s, QString::number(elementNumber()));
        break;

    case Float:
        writer.writeTextElement(u"float"_s, QString::number(elementFloat(), 'f', 8));
        break;

    case Double:
        writer.writeTextElement(u"double"_s, QString::number(elementDouble(), 'f', 15));
        break;

    case Date:
        if (m_date != nullptr)
            m_date->write(writer, u"date"_s);
        break;

    case Time:
        if (m_time != nullptr)
            m_time->write(writer, u"time"_s);
        break;

    case DateTime:
        if (m_dateTime != nullptr)
            m_dateTime->write(writer, u"datetime"_s);
        break;

    case PointF:
        if (m_pointF != nullptr)
            m_pointF->write(writer, u"pointf"_s);
        break;

    case RectF:
        if (m_rectF != nullptr)
            m_rectF->write(writer, u"rectf"_s);
        break;

    case SizeF:
        if (m_sizeF != nullptr)
            m_sizeF->write(writer, u"sizef"_s);
        break;

    case LongLong:
        writer.writeTextElement(u"longLong"_s, QString::number(elementLongLong()));
        break;

    case Char:
        if (m_char != nullptr)
            m_char->write(writer, u"char"_s);
        break;

    case Url:
        if (m_url != nullptr)
            m_url->write(writer, u"url"_s);
        break;

    case UInt:
        writer.writeTextElement(u"UInt"_s, QString::number(elementUInt()));
        break;

    case ULongLong:
        writer.writeTextElement(u"uLongLong"_s, QString::number(elementULongLong()));
        break;

    case Brush:
        if (m_brush != nullptr)
            m_brush->write(writer, u"brush"_s);
        break;

    default:
        break;
    }
    writer.writeEndElement();
}